

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::PromiseClient::promiseResolvedToThis
          (PromiseClient *this,bool receivedCall)

{
  DebugExpression<bool> _kjCondition;
  Fault f;
  
  _kjCondition.value = (bool)(this->isResolved ^ 1);
  if (this->isResolved == false) {
    this->receivedCall = (bool)(this->receivedCall | receivedCall);
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[167]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
             ,0x503,FAILED,"!isResolved",
             "_kjCondition,\"peer committed RPC protocol error: a promise cannot resolve to another promise \" \"where the latter promise is itself already resolved; see \" \"`CapDescriptor.senderPromise`.\""
             ,&_kjCondition,
             (char (*) [167])
             "peer committed RPC protocol error: a promise cannot resolve to another promise where the latter promise is itself already resolved; see `CapDescriptor.senderPromise`."
            );
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void promiseResolvedToThis(bool receivedCall) override {
      // Some other promise resolved to *this* promise.
      KJ_REQUIRE(!isResolved,
          "peer committed RPC protocol error: a promise cannot resolve to another promise "
          "where the latter promise is itself already resolved; see "
          "`CapDescriptor.senderPromise`.");
      this->receivedCall = this->receivedCall || receivedCall;
    }